

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O0

double xc_bessel_K0(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double unaff_retaddr;
  double r;
  double local_10;
  
  local_10 = 0.0;
  if (0.0 < in_XMM0_Qa) {
    if (2.0 < in_XMM0_Qa) {
      local_10 = exp(-in_XMM0_Qa);
      dVar1 = xc_bessel_K0_scaled(unaff_retaddr);
      local_10 = local_10 * dVar1;
    }
    else {
      dVar1 = log(in_XMM0_Qa * 0.5);
      dVar2 = xc_bessel_I0(unaff_retaddr);
      local_10 = xc_cheb_eval(in_XMM0_Qa * 0.5 * in_XMM0_Qa + -1.0,bk0_data,0xb);
      local_10 = -dVar1 * dVar2 + -0.25 + local_10;
    }
  }
  else {
    fprintf(_stderr,"Domain error in bessel_K0\n");
  }
  return local_10;
}

Assistant:

GPU_FUNCTION
double xc_bessel_K0(const double x)
{
  double r = 0.0;

  if(x <= 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Domain error in bessel_K0\n");
#endif
  } else if(x <= 2.0)
    r = -log(0.5*x)*xc_bessel_I0(x) - 0.25 + xc_cheb_eval(0.5*x*x - 1.0, bk0_data, 11);
  else
    r = exp(-x)*xc_bessel_K0_scaled(x);

  return r;
}